

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_examples.c
# Opt level: O0

psa_status_t
cipher_decrypt(psa_key_handle_t key_handle,psa_algorithm_t alg,uint8_t *iv,size_t iv_size,
              uint8_t *input,size_t input_size,size_t part_size,uint8_t *output,size_t output_size,
              size_t *output_len)

{
  undefined1 local_a0 [8];
  psa_cipher_operation_t operation;
  psa_status_t status;
  size_t input_size_local;
  uint8_t *input_local;
  size_t iv_size_local;
  uint8_t *iv_local;
  psa_algorithm_t alg_local;
  psa_key_handle_t key_handle_local;
  
  memset(local_a0,0,0x68);
  memset(local_a0,0,0x68);
  operation.ctx._92_4_ = psa_cipher_decrypt_setup((psa_cipher_operation_t *)local_a0,key_handle,alg)
  ;
  if (operation.ctx._92_4_ == 0) {
    operation.ctx._92_4_ = psa_cipher_set_iv((psa_cipher_operation_t *)local_a0,iv,iv_size);
    if (operation.ctx._92_4_ == 0) {
      operation.ctx._92_4_ =
           cipher_operation((psa_cipher_operation_t *)local_a0,input,input_size,part_size,output,
                            output_size,output_len);
      if (operation.ctx._92_4_ != 0) {
        printf("\tassertion failed at %s:%d - actual:%d expected:%d\r\n",
               "/workspace/llm4binary/github/license_c_cmakelists/ARMmbed[P]mbed-crypto/programs/psa/crypto_examples.c"
               ,0x84,(ulong)(uint)operation.ctx._92_4_,0);
      }
    }
    else {
      printf("\tassertion failed at %s:%d - actual:%d expected:%d\r\n",
             "/workspace/llm4binary/github/license_c_cmakelists/ARMmbed[P]mbed-crypto/programs/psa/crypto_examples.c"
             ,0x80,(ulong)(uint)operation.ctx._92_4_,0);
    }
  }
  else {
    printf("\tassertion failed at %s:%d - actual:%d expected:%d\r\n",
           "/workspace/llm4binary/github/license_c_cmakelists/ARMmbed[P]mbed-crypto/programs/psa/crypto_examples.c"
           ,0x7d,(ulong)(uint)operation.ctx._92_4_,0);
  }
  psa_cipher_abort((psa_cipher_operation_t *)local_a0);
  return operation.ctx._92_4_;
}

Assistant:

static psa_status_t cipher_decrypt( psa_key_handle_t key_handle,
                                    psa_algorithm_t alg,
                                    const uint8_t * iv,
                                    size_t iv_size,
                                    const uint8_t * input,
                                    size_t input_size,
                                    size_t part_size,
                                    uint8_t * output,
                                    size_t output_size,
                                    size_t *output_len )
{
    psa_status_t status;
    psa_cipher_operation_t operation = PSA_CIPHER_OPERATION_INIT;

    memset( &operation, 0, sizeof( operation ) );
    status = psa_cipher_decrypt_setup( &operation, key_handle, alg );
    ASSERT_STATUS( status, PSA_SUCCESS );

    status = psa_cipher_set_iv( &operation, iv, iv_size );
    ASSERT_STATUS( status, PSA_SUCCESS );

    status = cipher_operation( &operation, input, input_size, part_size,
                               output, output_size, output_len );
    ASSERT_STATUS( status, PSA_SUCCESS );

exit:
    psa_cipher_abort( &operation );
    return( status );
}